

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeBuilder::registerLabelNode(CodeBuilder *this,CBLabel *node)

{
  Error EVar1;
  ZoneHeap *heap;
  long in_RSI;
  size_t in_RDI;
  Error _err_1;
  size_t index;
  Error _err;
  uint32_t id;
  char *in_stack_00000370;
  int in_stack_0000037c;
  char *in_stack_00000380;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  CodeHolder *in_stack_ffffffffffffffc8;
  
  if (*(int *)(in_RDI + 0x2c) == 0) {
    if (*(long *)(in_RDI + 0x18) == 0) {
      DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
    }
    EVar1 = CodeHolder::newLabelId
                      (in_stack_ffffffffffffffc8,
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (EVar1 == 0) {
      heap = (ZoneHeap *)(ulong)(in_stack_ffffffffffffffac - 0x100);
      if ((undefined1 *)((long)&heap->_zone + 1) <= *(undefined1 **)(in_RDI + 0x158)) {
        DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
      }
      EVar1 = ZoneVectorBase::_resize
                        ((ZoneVectorBase *)((ulong)in_stack_ffffffffffffffac << 0x20),heap,
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_RDI);
      if (EVar1 == 0) {
        if (*(ZoneHeap **)(in_RDI + 0x158) <= heap) {
          DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
        }
        *(long *)(*(long *)(in_RDI + 0x150) + (long)heap * 8) = in_RSI;
        *(uint *)(in_RSI + 0x28) = in_stack_ffffffffffffffac;
        EVar1 = 0;
      }
    }
  }
  else {
    EVar1 = *(Error *)(in_RDI + 0x2c);
  }
  return EVar1;
}

Assistant:

Error CodeBuilder::registerLabelNode(CBLabel* node) noexcept {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  // Don't call setLastError() from here, we are noexcept and we are called
  // by `newLabelNode()` and `newFuncNode()`, which are noexcept as well.
  uint32_t id;
  ASMJIT_PROPAGATE(_code->newLabelId(id));
  size_t index = Operand::unpackId(id);

  // We just added one label so it must be true.
  ASMJIT_ASSERT(_cbLabels.getLength() < index + 1);
  ASMJIT_PROPAGATE(_cbLabels.resize(&_cbHeap, index + 1));

  _cbLabels[index] = node;
  node->_id = id;
  return kErrorOk;
}